

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

void AddNodeWeight(uint *iScene,aiNode *pcNode)

{
  uint local_1c;
  uint i;
  aiNode *pcNode_local;
  uint *iScene_local;
  
  if (pcNode != (aiNode *)0x0) {
    *iScene = *iScene + 0x478;
    *iScene = *iScene + pcNode->mNumMeshes * 4;
    *iScene = *iScene + pcNode->mNumChildren * 8;
    for (local_1c = 0; local_1c < pcNode->mNumChildren; local_1c = local_1c + 1) {
      AddNodeWeight(iScene,pcNode->mChildren[local_1c]);
    }
  }
  return;
}

Assistant:

inline 
void AddNodeWeight(unsigned int& iScene,const aiNode* pcNode) {
    if ( nullptr == pcNode ) {
        return;
    }
    iScene += sizeof(aiNode);
    iScene += sizeof(unsigned int) * pcNode->mNumMeshes;
    iScene += sizeof(void*) * pcNode->mNumChildren;

    for (unsigned int i = 0; i < pcNode->mNumChildren;++i) {
        AddNodeWeight(iScene,pcNode->mChildren[i]);
    }
}